

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O3

void __thiscall
cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
Object<(anonymous_namespace)::CMakeVersion>::Object
          (Object<(anonymous_namespace)::CMakeVersion> *this,
          Object<(anonymous_namespace)::CMakeVersion> *param_1)

{
  pointer pMVar1;
  _Manager_type p_Var2;
  undefined8 uVar3;
  char *pcVar4;
  _Invoker_type p_Var5;
  undefined3 uVar6;
  ReadFileResult RVar7;
  pointer pMVar8;
  long lVar9;
  pointer pMVar10;
  
  lVar9 = (long)(param_1->Members).
                super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(param_1->Members).
                super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
                ._M_impl.super__Vector_impl_data._M_start;
  (this->Members).
  super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Members).
  super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Members).
  super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pMVar8 = std::
           _Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
           ::_M_allocate((_Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
                          *)((lVar9 >> 3) * 0x6db6db6db6db6db7),(size_t)param_1);
  (this->Members).
  super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
  ._M_impl.super__Vector_impl_data._M_start = pMVar8;
  (this->Members).
  super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
  ._M_impl.super__Vector_impl_data._M_finish = pMVar8;
  (this->Members).
  super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(lVar9 + (long)pMVar8);
  pMVar1 = (param_1->Members).
           super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pMVar10 = (param_1->Members).
                 super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
                 ._M_impl.super__Vector_impl_data._M_start; pMVar10 != pMVar1; pMVar10 = pMVar10 + 1
      ) {
    pcVar4 = (pMVar10->Name)._M_str;
    (pMVar8->Name)._M_len = (pMVar10->Name)._M_len;
    (pMVar8->Name)._M_str = pcVar4;
    *(undefined8 *)&(pMVar8->Function).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(pMVar8->Function).super__Function_base._M_functor + 8) = 0;
    (pMVar8->Function).super__Function_base._M_manager = (_Manager_type)0x0;
    (pMVar8->Function)._M_invoker = (_Invoker_type)0x0;
    p_Var2 = (pMVar10->Function).super__Function_base._M_manager;
    if (p_Var2 != (_Manager_type)0x0) {
      (*p_Var2)((_Any_data *)&pMVar8->Function,(_Any_data *)&pMVar10->Function,__clone_functor);
      p_Var5 = (pMVar10->Function)._M_invoker;
      (pMVar8->Function).super__Function_base._M_manager =
           (pMVar10->Function).super__Function_base._M_manager;
      (pMVar8->Function)._M_invoker = p_Var5;
    }
    pMVar8->Required = pMVar10->Required;
    pMVar8 = pMVar8 + 1;
  }
  (this->Members).
  super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
  ._M_impl.super__Vector_impl_data._M_finish = pMVar8;
  uVar6 = *(undefined3 *)&param_1->field_0x19;
  RVar7 = param_1->Success;
  uVar3 = *(undefined8 *)((long)&param_1->Success + 1);
  this->AnyRequired = param_1->AnyRequired;
  *(undefined3 *)&this->field_0x19 = uVar6;
  this->Success = RVar7;
  *(undefined8 *)((long)&this->Success + 1) = uVar3;
  return;
}

Assistant:

Object(E&& success, E&& fail, bool allowExtra = true)
      : Success(std::move(success))
      , Fail(std::move(fail))
      , AllowExtra(allowExtra)
    {
    }